

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void OptimizeModule(CompilerContext *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  VmModule *pVVar7;
  uint uVar8;
  int iVar9;
  ExpressionContext *ctx_00;
  int local_74;
  uint after;
  uint before;
  TraceScope traceScope_2;
  undefined1 local_50 [4];
  uint i;
  TraceScope traceScope_1;
  TraceScope traceScope;
  VmFunction *local_20;
  VmFunction *function;
  ExpressionContext *exprCtx;
  CompilerContext *ctx_local;
  
  ctx_00 = &ctx->exprCtx;
  uVar8 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar8);
  local_20 = (ctx->vmModule->functions).head;
  do {
    if (local_20 == (VmFunction *)0x0) {
      uVar8 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"IrOptimization",uVar8);
      return;
    }
    if (local_20->firstBlock != (VmBlock *)0x0) {
      if (ctx->optimizationLevel == 0) {
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
      }
      if (0 < ctx->optimizationLevel) {
        if ((OptimizeModule(CompilerContext&)::token == '\0') &&
           (iVar9 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar9 != 0)) {
          OptimizeModule::token = NULLC::TraceGetToken("compiler","OptimizationLevel1");
          __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
        }
        NULLC::TraceScope::TraceScope
                  ((TraceScope *)&traceScope_1.lastEventPos,OptimizeModule::token);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_PEEPHOLE);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_CONSTANT_PROPAGATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_LOAD_STORE_PROPAGATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_ARRAY_TO_ELEMENTS);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        NULLC::TraceScope::~TraceScope((TraceScope *)&traceScope_1.lastEventPos);
      }
      RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_LEGALIZE_ARRAY_VALUES);
      if (1 < ctx->optimizationLevel) {
        if ((OptimizeModule(CompilerContext&)::token == '\0') &&
           (iVar9 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar9 != 0)) {
          OptimizeModule(CompilerContext&)::token =
               NULLC::TraceGetToken("compiler","OptimizationLevel2");
          __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
        }
        NULLC::TraceScope::TraceScope
                  ((TraceScope *)local_50,OptimizeModule(CompilerContext&)::token);
        for (traceScope_2.lastLabelPos = 0; traceScope_2.lastLabelPos < 6;
            traceScope_2.lastLabelPos = traceScope_2.lastLabelPos + 1) {
          if ((OptimizeModule(CompilerContext&)::token == '\0') &&
             (iVar9 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar9 != 0)) {
            OptimizeModule(CompilerContext&)::token = NULLC::TraceGetToken("compiler","iteration");
            __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
          }
          NULLC::TraceScope::TraceScope
                    ((TraceScope *)&after,OptimizeModule(CompilerContext&)::token);
          pVVar7 = ctx->vmModule;
          uVar8 = pVVar7->peepholeOptimizations;
          uVar1 = pVVar7->constantPropagations;
          uVar2 = pVVar7->deadCodeEliminations;
          uVar3 = pVVar7->controlFlowSimplifications;
          uVar4 = pVVar7->loadStorePropagations;
          uVar5 = pVVar7->commonSubexprEliminations;
          uVar6 = pVVar7->deadAllocaStoreEliminations;
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_CONSTANT_PROPAGATION);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_LOAD_STORE_PROPAGATION);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_PEEPHOLE);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
          if (uVar8 + uVar1 + uVar2 + uVar3 + uVar4 + uVar5 + uVar6 ==
              ctx->vmModule->peepholeOptimizations + ctx->vmModule->constantPropagations +
              ctx->vmModule->deadCodeEliminations + ctx->vmModule->controlFlowSimplifications +
              ctx->vmModule->loadStorePropagations + ctx->vmModule->commonSubexprEliminations +
              ctx->vmModule->deadAllocaStoreEliminations) {
            local_74 = 5;
          }
          else {
            local_74 = 0;
          }
          NULLC::TraceScope::~TraceScope((TraceScope *)&after);
          if (local_74 != 0) break;
        }
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_MEMORY_TO_REGISTER);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_LATE_PEEPHOLE);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,local_20,VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
        NULLC::TraceScope::~TraceScope((TraceScope *)local_50);
      }
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

void OptimizeModule(CompilerContext &ctx)
{
	ExpressionContext &exprCtx = ctx.exprCtx;

	ctx.statistics.Start(NULLCTime::clockMicro());

	for(VmFunction *function = ctx.vmModule->functions.head; function; function = function->next)
	{
		if(!function->firstBlock)
			continue;

		// Dead code elimination is required for correct register allocation
		if(ctx.optimizationLevel == 0)
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

		if(ctx.optimizationLevel >= 1)
		{
			TRACE_SCOPE("compiler", "OptimizationLevel1");

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_PEEPHOLE);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONSTANT_PROPAGATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LOAD_STORE_PROPAGATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_ARRAY_TO_ELEMENTS);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
		}

		RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_LEGALIZE_ARRAY_VALUES);

		if(ctx.optimizationLevel >= 2)
		{
			TRACE_SCOPE("compiler", "OptimizationLevel2");

			for(unsigned i = 0; i < 6; i++)
			{
				TRACE_SCOPE("compiler", "iteration");

				unsigned before = ctx.vmModule->peepholeOptimizations + ctx.vmModule->constantPropagations + ctx.vmModule->deadCodeEliminations + ctx.vmModule->controlFlowSimplifications + ctx.vmModule->loadStorePropagations + ctx.vmModule->commonSubexprEliminations + ctx.vmModule->deadAllocaStoreEliminations;

				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONSTANT_PROPAGATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LOAD_STORE_PROPAGATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_PEEPHOLE);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);

				unsigned after = ctx.vmModule->peepholeOptimizations + ctx.vmModule->constantPropagations + ctx.vmModule->deadCodeEliminations + ctx.vmModule->controlFlowSimplifications + ctx.vmModule->loadStorePropagations + ctx.vmModule->commonSubexprEliminations + ctx.vmModule->deadAllocaStoreEliminations;

				// Reached fixed point
				if(before == after)
					break;
			}

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_MEMORY_TO_REGISTER);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LATE_PEEPHOLE);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
		}
	}

	ctx.statistics.Finish("IrOptimization", NULLCTime::clockMicro());
}